

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O3

void __thiscall
string_view_operator_less_than_or_equal_Test::TestBody
          (string_view_operator_less_than_or_equal_Test *this)

{
  bool bVar1;
  int iVar2;
  char *in_R9;
  string_view s;
  string_view s_00;
  string_view s_01;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  
  local_40._M_dataplus._M_p = "abc";
  local_40._M_string_length = 3;
  s.size_ = 3;
  s.data_ = "xyz";
  iVar2 = wabt::string_view::compare((string_view *)&local_40,s);
  local_50[0] = (internal)(iVar2 < 1);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar2 < 1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40._M_dataplus._M_p = "later";
    local_40._M_string_length = 5;
    s_00.size_ = 7;
    s_00.data_ = "earlier";
    iVar2 = wabt::string_view::compare((string_view *)&local_40,s_00);
    local_50[0] = (internal)(0 < iVar2);
    local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 < 1) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,local_50,
                 (AssertionResult *)"string_view(\"later\") <= string_view(\"earlier\")","true",
                 "false",in_R9);
      iVar2 = 400;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_40._M_dataplus._M_p = "one";
      local_40._M_string_length = 3;
      s_01.size_ = 3;
      s_01.data_ = "one";
      iVar2 = wabt::string_view::compare((string_view *)&local_40,s_01);
      local_50[0] = (internal)(iVar2 < 1);
      local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 < 1) goto LAB_001f326a;
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,local_50,
                 (AssertionResult *)"string_view(\"one\") <= string_view(\"one\")","false","true",
                 in_R9);
      iVar2 = 0x191;
    }
  }
  else {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,(AssertionResult *)"string_view(\"abc\") <= string_view(\"xyz\")",
               "false","true",in_R9);
    iVar2 = 399;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
             ,iVar2,local_40._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_60.ptr_ + 8))();
    }
  }
LAB_001f326a:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(string_view, operator_less_than_or_equal) {
  ASSERT_TRUE(string_view("abc") <= string_view("xyz"));
  ASSERT_FALSE(string_view("later") <= string_view("earlier"));
  ASSERT_TRUE(string_view("one") <= string_view("one"));
}